

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O3

ON_MappingRef * __thiscall
ON_ClassArray<ON_MappingRef>::AppendNew(ON_ClassArray<ON_MappingRef> *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  
  uVar1 = this->m_count;
  if (uVar1 == this->m_capacity) {
    if (((int)uVar1 < 8) || ((ulong)((long)(int)uVar1 * 0x28) < 0x10000001)) {
      uVar3 = 4;
      if (2 < (int)uVar1) {
        uVar3 = uVar1 * 2;
      }
    }
    else {
      uVar3 = 0x66666e;
      if (uVar1 < 0x66666e) {
        uVar3 = uVar1;
      }
      uVar3 = uVar3 + uVar1;
    }
    if (uVar1 < uVar3) {
      SetCapacity(this,(long)(int)uVar3);
    }
  }
  else {
    ON_SimpleArray<ON_MappingChannel>::~ON_SimpleArray(&this->m_a[(int)uVar1].m_mapping_channels);
    ON_MappingRef::ON_MappingRef(this->m_a + this->m_count);
  }
  iVar2 = this->m_count;
  this->m_count = iVar2 + 1;
  return this->m_a + iVar2;
}

Assistant:

T& ON_ClassArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int newcapacity = NewCapacity();
    Reserve( newcapacity );
  }
  else
  {
    // First destroy what's there ..
    DestroyElement(m_a[m_count]);
    // and then get a properly initialized element
    ConstructDefaultElement(&m_a[m_count]);
  }
  return m_a[m_count++];
}